

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O3

void open_multi_files_kvs_test(void)

{
  fdb_encryption_key new_key;
  void *ptr;
  fdb_iterator **ppfVar1;
  fdb_status fVar2;
  int iVar3;
  size_t sVar4;
  fdb_kvs_handle *pfVar5;
  size_t valuelen;
  char *ptr_handle;
  fdb_config *fconfig_00;
  uint uVar6;
  ulong uVar7;
  fdb_iterator **doc;
  char *pcVar8;
  fdb_iterator **ptr_iterator;
  char *handle;
  bool bVar9;
  fdb_iterator *iterator;
  fdb_doc *rdoc;
  fdb_kvs_config kvs_config;
  fdb_kvs_info kvs_info;
  timeval __test_begin;
  char keybuf [256];
  fdb_config fconfig;
  char fname [256];
  char bodybuf [256];
  fdb_kvs_handle *pfStack_4d10;
  fdb_file_handle *pfStack_4d08;
  void *pvStack_4d00;
  size_t asStack_4cf8 [3];
  undefined4 uStack_4ce0;
  undefined4 uStack_4cdc;
  undefined4 uStack_4cd8;
  undefined4 uStack_4cd4;
  undefined4 uStack_4cd0;
  fdb_kvs_config fStack_4cc8;
  timeval tStack_4cb0;
  fdb_config fStack_4ca0;
  char acStack_4ba8 [256];
  char acStack_4aa8 [256];
  char acStack_49a8 [264];
  fdb_config *pfStack_48a0;
  fdb_iterator **ppfStack_4898;
  fdb_kvs_handle *pfStack_4890;
  fdb_iterator **ppfStack_4888;
  fdb_kvs_handle *pfStack_4880;
  code *pcStack_4878;
  fdb_iterator *pfStack_4860;
  fdb_file_handle *pfStack_4858;
  fdb_kvs_handle *pfStack_4850;
  fdb_kvs_handle *pfStack_4848;
  fdb_kvs_config fStack_4840;
  timeval tStack_4828;
  fdb_config fStack_4818;
  fdb_iterator *apfStack_4720 [32];
  fdb_config fStack_4620;
  fdb_kvs_handle **ppfStack_4518;
  fdb_iterator **ppfStack_4510;
  fdb_iterator **ppfStack_4508;
  fdb_kvs_handle *pfStack_4500;
  fdb_iterator *local_44f0;
  fdb_kvs_handle *local_44e8;
  fdb_iterator **local_44e0;
  fdb_kvs_handle *local_44d8;
  fdb_kvs_config local_44d0;
  fdb_kvs_handle *local_44b8 [8];
  undefined1 local_4478 [64];
  fdb_iterator *local_4438 [33];
  fdb_config local_4330;
  fdb_iterator *local_4238 [32];
  fdb_iterator *local_4138 [32];
  fdb_kvs_handle local_4038;
  undefined8 auStack_3c38 [896];
  fdb_kvs_handle *local_2038 [1025];
  
  pfStack_4500 = (fdb_kvs_handle *)0x1191df;
  gettimeofday((timeval *)(local_4478 + 0x30),(__timezone_ptr_t)0x0);
  pfStack_4500 = (fdb_kvs_handle *)0x1191e4;
  memleak_start();
  pfStack_4500 = (fdb_kvs_handle *)0x1191f0;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_4500 = (fdb_kvs_handle *)0x119200;
  fdb_get_default_config();
  pfStack_4500 = (fdb_kvs_handle *)0x11920a;
  fdb_get_default_kvs_config();
  local_4330.wal_threshold = 0x400;
  local_4330.compaction_mode = '\0';
  local_4330.durability_opt = '\x02';
  handle = (char *)&local_4038;
  doc = local_4238;
  pcVar8 = "kvs%d";
  uVar7 = 0;
  ptr_iterator = (fdb_iterator **)0x0;
  do {
    pfStack_4500 = (fdb_kvs_handle *)0x11924a;
    sprintf((char *)doc,"dummy%d",(ulong)ptr_iterator & 0xffffffff);
    ptr_handle = (char *)(local_44b8 + (long)ptr_iterator);
    pfStack_4500 = (fdb_kvs_handle *)0x119265;
    fVar2 = fdb_open((fdb_file_handle **)ptr_handle,(char *)doc,&local_4330);
    pfVar5 = (fdb_kvs_handle *)handle;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011969e;
    ppfVar1 = (fdb_iterator **)0x0;
    local_44e0 = ptr_iterator;
    local_44d8 = (fdb_kvs_handle *)handle;
    do {
      ptr_iterator = ppfVar1;
      pfStack_4500 = (fdb_kvs_handle *)0x11928b;
      sprintf((char *)doc,"kvs%d",(ulong)(uint)((int)ptr_iterator + (int)uVar7));
      pfStack_4500 = (fdb_kvs_handle *)0x11929e;
      fVar2 = fdb_kvs_open((fdb_file_handle *)*(fdb_kvs_handle **)ptr_handle,
                           (fdb_kvs_handle **)handle,(char *)doc,&local_44d0);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_4500 = (fdb_kvs_handle *)0x11968a;
        open_multi_files_kvs_test();
        goto LAB_0011968a;
      }
      handle = (char *)&(((fdb_kvs_handle *)handle)->kvs_config).custom_cmp;
      ppfVar1 = (fdb_iterator **)((long)ptr_iterator + 1);
    } while ((fdb_iterator **)((long)ptr_iterator + 1) != (fdb_iterator **)0x80);
    ptr_iterator = (fdb_iterator **)((long)local_44e0 + 1);
    uVar7 = uVar7 + 0x80;
    handle = (char *)&local_44d8[1].bub_ctx.space_used;
  } while (ptr_iterator != (fdb_iterator **)0x8);
  ptr_iterator = local_4438;
  doc = local_4138;
  pfVar5 = (fdb_kvs_handle *)0x0;
  do {
    uVar7 = 0;
    do {
      pfStack_4500 = (fdb_kvs_handle *)0x119300;
      sprintf((char *)ptr_iterator,"key%08d",uVar7);
      pfStack_4500 = (fdb_kvs_handle *)0x119313;
      sprintf((char *)doc,"value%08d",uVar7);
      pcVar8 = *(char **)(&local_4038.kvs_config.create_if_missing + (long)pfVar5 * 8);
      pfStack_4500 = (fdb_kvs_handle *)0x119323;
      sVar4 = strlen((char *)ptr_iterator);
      ptr_handle = (char *)(sVar4 + 1);
      pfStack_4500 = (fdb_kvs_handle *)0x11932f;
      sVar4 = strlen((char *)doc);
      pfStack_4500 = (fdb_kvs_handle *)0x119344;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar8,ptr_iterator,(size_t)ptr_handle,doc,sVar4 + 1);
      handle = (char *)pfVar5;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011968a;
      uVar6 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar6;
    } while (uVar6 != 10);
    pfVar5 = (fdb_kvs_handle *)&(pfVar5->kvs_config).field_0x1;
  } while (pfVar5 != (fdb_kvs_handle *)0x400);
  ptr_handle = (char *)0x0;
  do {
    if (((ulong)ptr_handle & 1) == 0) {
      pfStack_4500 = (fdb_kvs_handle *)0x119372;
      fVar2 = fdb_commit((fdb_file_handle *)local_44b8[(long)ptr_handle],'\0');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001196bc;
    }
    else {
      pfStack_4500 = (fdb_kvs_handle *)0x119385;
      fVar2 = fdb_commit((fdb_file_handle *)local_44b8[(long)ptr_handle],'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001196c1;
    }
    ptr_handle = (char *)((long)ptr_handle + 1);
  } while ((fdb_kvs_handle **)ptr_handle != (fdb_kvs_handle **)0x8);
  doc = (fdb_iterator **)0xffffffffffffff80;
  ptr_handle = (char *)local_2038;
  ptr_iterator = (fdb_iterator **)(local_4478 + 8);
  pfVar5 = (fdb_kvs_handle *)local_4478;
  do {
    pfStack_4500 = (fdb_kvs_handle *)0x1193c5;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_3c38[(long)doc],(fdb_kvs_info *)pfVar5);
    if ((fdb_custom_cmp_variable)local_4478._8_8_ != (fdb_custom_cmp_variable)0xa) {
      pfStack_4500 = (fdb_kvs_handle *)0x11940b;
      open_multi_files_kvs_test();
    }
    pfStack_4500 = (fdb_kvs_handle *)0x1193e5;
    fVar2 = fdb_snapshot_open((fdb_kvs_handle *)auStack_3c38[(long)doc],
                              (fdb_kvs_handle **)ptr_handle,10);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001196a3;
    doc = doc + 0x10;
    ptr_handle = (char *)((long)ptr_handle + 0x400);
  } while (doc < (fdb_iterator **)0x380);
  ptr_handle = (char *)0x0;
  do {
    pfStack_4500 = (fdb_kvs_handle *)0x11941b;
    fVar2 = fdb_compact((fdb_file_handle *)local_44b8[(long)ptr_handle],(char *)0x0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001196a8;
    ptr_handle = (char *)((long)ptr_handle + 1);
  } while ((fdb_kvs_handle **)ptr_handle != (fdb_kvs_handle **)0x8);
  ptr_handle = (char *)&local_44e8;
  local_44e8 = (fdb_kvs_handle *)0x0;
  ptr_iterator = &local_44f0;
  handle = "key%08d";
  doc = local_4438;
  pfVar5 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_4500 = (fdb_kvs_handle *)0x119470;
    fdb_iterator_init(local_2038[(long)pfVar5],ptr_iterator,(void *)0x0,0,(void *)0x0,0,0);
    uVar7 = 0;
    do {
      pfStack_4500 = (fdb_kvs_handle *)0x11947f;
      fVar2 = fdb_iterator_get(local_44f0,(fdb_doc **)ptr_handle);
      pcVar8 = (char *)pfVar5;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011968f;
      pfStack_4500 = (fdb_kvs_handle *)0x119496;
      sprintf((char *)doc,"key%08d",uVar7);
      pfStack_4500 = (fdb_kvs_handle *)0x1194a7;
      iVar3 = strcmp((char *)doc,(char *)local_44e8->op_stats);
      if (iVar3 != 0) {
        pfStack_4500 = (fdb_kvs_handle *)0x1194c9;
        open_multi_files_kvs_test();
      }
      uVar7 = (ulong)((int)uVar7 + 1);
      pfStack_4500 = (fdb_kvs_handle *)0x1194b7;
      fVar2 = fdb_iterator_next(local_44f0);
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_4500 = (fdb_kvs_handle *)0x1194d5;
    fdb_iterator_close(local_44f0);
    pcVar8 = (char *)&(pfVar5->config).wal_threshold;
    bVar9 = pfVar5 < (fdb_kvs_handle *)0x380;
    pfVar5 = (fdb_kvs_handle *)pcVar8;
  } while (bVar9);
  pfStack_4500 = (fdb_kvs_handle *)0x1194f6;
  fdb_doc_free((fdb_doc *)local_44e8);
  ptr_handle = "key%08d";
  ptr_iterator = local_4438;
  doc = (fdb_iterator **)0x0;
  do {
    uVar7 = 0;
    do {
      pfStack_4500 = (fdb_kvs_handle *)0x119519;
      sprintf((char *)ptr_iterator,"key%08d",uVar7);
      handle = *(char **)(&local_4038.kvs_config.create_if_missing + (long)doc * 8);
      pfStack_4500 = (fdb_kvs_handle *)0x119529;
      sVar4 = strlen((char *)ptr_iterator);
      pfStack_4500 = (fdb_kvs_handle *)0x119538;
      fVar2 = fdb_del_kv((fdb_kvs_handle *)handle,ptr_iterator,sVar4 + 1);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00119694;
      uVar6 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar6;
    } while (uVar6 != 10);
    doc = (fdb_iterator **)((long)doc + 1);
  } while (doc != (fdb_iterator **)0x400);
  ptr_handle = "dummy_compact%d";
  ptr_iterator = local_4238;
  pfVar5 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_4500 = (fdb_kvs_handle *)0x119575;
    sprintf((char *)ptr_iterator,"dummy_compact%d",(ulong)pfVar5 & 0xffffffff);
    pfStack_4500 = (fdb_kvs_handle *)0x119582;
    fVar2 = fdb_compact((fdb_file_handle *)local_44b8[(long)pfVar5],(char *)ptr_iterator);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001196ad;
    pfVar5 = (fdb_kvs_handle *)&(pfVar5->kvs_config).field_0x1;
  } while (pfVar5 != (fdb_kvs_handle *)0x8);
  ptr_handle = (char *)&local_44e8;
  local_44e8 = (fdb_kvs_handle *)0x0;
  ptr_iterator = &local_44f0;
  handle = (char *)(fdb_kvs_handle *)0x0;
  do {
    pfStack_4500 = (fdb_kvs_handle *)0x1195c8;
    fVar2 = fdb_iterator_init(*(fdb_kvs_handle **)
                               (&local_4038.kvs_config.create_if_missing + (long)handle * 8),
                              ptr_iterator,(void *)0x0,0,(void *)0x0,0,2);
    pfVar5 = (fdb_kvs_handle *)handle;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001196b2;
    do {
      pfStack_4500 = (fdb_kvs_handle *)0x1195dd;
      fVar2 = fdb_iterator_get(local_44f0,(fdb_doc **)ptr_handle);
      if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_00119699;
      pfStack_4500 = (fdb_kvs_handle *)0x1195ef;
      fVar2 = fdb_iterator_next(local_44f0);
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_4500 = (fdb_kvs_handle *)0x1195fe;
    fdb_iterator_close(local_44f0);
    pfVar5 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)handle)->config).wal_threshold;
    bVar9 = handle < (fdb_kvs_handle *)0x380;
    handle = (char *)pfVar5;
  } while (bVar9);
  pfStack_4500 = (fdb_kvs_handle *)0x11961b;
  fdb_doc_free((fdb_doc *)local_44e8);
  ptr_handle = (char *)0x0;
  while( true ) {
    pfStack_4500 = (fdb_kvs_handle *)0x119627;
    fVar2 = fdb_close((fdb_file_handle *)local_44b8[(long)ptr_handle]);
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    ptr_handle = (char *)((long)ptr_handle + 1);
    if ((fdb_kvs_handle **)ptr_handle == (fdb_kvs_handle **)0x8) {
      pfStack_4500 = (fdb_kvs_handle *)0x11963d;
      fdb_shutdown();
      pfStack_4500 = (fdb_kvs_handle *)0x119642;
      memleak_end();
      pcVar8 = "%s PASSED\n";
      if (open_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pfStack_4500 = (fdb_kvs_handle *)0x119673;
      fprintf(_stderr,pcVar8,"open multi files kvs test");
      return;
    }
  }
LAB_001196b7:
  pfStack_4500 = (fdb_kvs_handle *)0x1196bc;
  open_multi_files_kvs_test();
LAB_001196bc:
  pfStack_4500 = (fdb_kvs_handle *)0x1196c1;
  open_multi_files_kvs_test();
LAB_001196c1:
  pfStack_4500 = (fdb_kvs_handle *)get_byoffset_diff_kvs_test;
  open_multi_files_kvs_test();
  pcStack_4878 = (code *)0x1196e0;
  ppfStack_4518 = (fdb_kvs_handle **)ptr_handle;
  ppfStack_4510 = doc;
  ppfStack_4508 = ptr_iterator;
  pfStack_4500 = pfVar5;
  gettimeofday(&tStack_4828,(__timezone_ptr_t)0x0);
  pcStack_4878 = (code *)0x1196e5;
  memleak_start();
  pcStack_4878 = (code *)0x1196f1;
  system("rm -rf  dummy* > errorlog.txt");
  fconfig_00 = &fStack_4818;
  pcStack_4878 = (code *)0x1196fe;
  fdb_get_default_config();
  pcStack_4878 = (code *)0x119708;
  fdb_get_default_kvs_config();
  pcStack_4878 = (code *)0x11971c;
  fVar2 = fdb_open(&pfStack_4858,"./dummy1",fconfig_00);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_4878 = (code *)0x11973f;
    fVar2 = fdb_kvs_open(pfStack_4858,&pfStack_4850,"db",&fStack_4840);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001198f2;
    pcStack_4878 = (code *)0x119762;
    fVar2 = fdb_kvs_open(pfStack_4858,&pfStack_4848,"db2",&fStack_4840);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001198f7;
    fconfig_00 = &fStack_4620;
    pcStack_4878 = (code *)0x119785;
    sprintf((char *)fconfig_00,"key%d",0);
    ptr_iterator = apfStack_4720;
    pcStack_4878 = (code *)0x1197a0;
    sprintf((char *)ptr_iterator,"body%d",0);
    pcStack_4878 = (code *)0x1197a8;
    pfVar5 = (fdb_kvs_handle *)strlen((char *)fconfig_00);
    pcStack_4878 = (code *)0x1197b3;
    sVar4 = strlen((char *)ptr_iterator);
    doc = &pfStack_4860;
    pcStack_4878 = (code *)0x1197d5;
    fdb_doc_create((fdb_doc **)doc,fconfig_00,(size_t)pfVar5,(void *)0x0,0,ptr_iterator,sVar4 + 1);
    pcStack_4878 = (code *)0x1197e3;
    fVar2 = fdb_set(pfStack_4850,(fdb_doc *)pfStack_4860);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001198fc;
    pcStack_4878 = (code *)0x1197fa;
    fVar2 = fdb_commit(pfStack_4858,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00119901;
    pcStack_4878 = (code *)0x11981b;
    sprintf((char *)pfStack_4860->tree_cursor_prev,"bOdy%d",0);
    pcStack_4878 = (code *)0x11982a;
    fVar2 = fdb_set(pfStack_4848,(fdb_doc *)pfStack_4860);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00119906;
    pcStack_4878 = (code *)0x119841;
    fVar2 = fdb_commit(pfStack_4858,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011990b;
    pcStack_4878 = (code *)0x119858;
    fVar2 = fdb_get_metaonly(pfStack_4850,(fdb_doc *)pfStack_4860);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00119910;
    pcStack_4878 = (code *)0x11986f;
    fVar2 = fdb_get_metaonly(pfStack_4848,(fdb_doc *)pfStack_4860);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00119915;
    pcStack_4878 = (code *)0x119886;
    fVar2 = fdb_get_byoffset(pfStack_4850,(fdb_doc *)pfStack_4860);
    if (fVar2 == FDB_RESULT_KEY_NOT_FOUND) {
      pcStack_4878 = (code *)0x119899;
      fdb_close(pfStack_4858);
      pcStack_4878 = (code *)0x1198a3;
      fdb_doc_free((fdb_doc *)pfStack_4860);
      pcStack_4878 = (code *)0x1198a8;
      fdb_shutdown();
      pcStack_4878 = (code *)0x1198ad;
      memleak_end();
      pcVar8 = "%s PASSED\n";
      if (get_byoffset_diff_kvs_test()::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pcStack_4878 = (code *)0x1198de;
      fprintf(_stderr,pcVar8,"get byoffset diff kvs");
      return;
    }
  }
  else {
    pcStack_4878 = (code *)0x1198f2;
    get_byoffset_diff_kvs_test();
LAB_001198f2:
    pcStack_4878 = (code *)0x1198f7;
    get_byoffset_diff_kvs_test();
LAB_001198f7:
    pcStack_4878 = (code *)0x1198fc;
    get_byoffset_diff_kvs_test();
LAB_001198fc:
    pcStack_4878 = (code *)0x119901;
    get_byoffset_diff_kvs_test();
LAB_00119901:
    pcStack_4878 = (code *)0x119906;
    get_byoffset_diff_kvs_test();
LAB_00119906:
    pcStack_4878 = (code *)0x11990b;
    get_byoffset_diff_kvs_test();
LAB_0011990b:
    pcStack_4878 = (code *)0x119910;
    get_byoffset_diff_kvs_test();
LAB_00119910:
    pcStack_4878 = (code *)0x119915;
    get_byoffset_diff_kvs_test();
LAB_00119915:
    pcStack_4878 = (code *)0x11991a;
    get_byoffset_diff_kvs_test();
  }
  pcStack_4878 = rekey_test;
  get_byoffset_diff_kvs_test();
  pfStack_48a0 = fconfig_00;
  ppfStack_4898 = doc;
  pfStack_4890 = (fdb_kvs_handle *)pcVar8;
  ppfStack_4888 = ptr_iterator;
  pfStack_4880 = pfVar5;
  pcStack_4878 = (code *)uVar7;
  gettimeofday(&tStack_4cb0,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_4ca0.wal_threshold = 0x400;
  fStack_4ca0.flags = 1;
  fStack_4ca0.purging_interval = 0;
  fStack_4ca0.compaction_threshold = '\0';
  fStack_4ca0.encryption_key.algorithm = -1;
  builtin_memcpy(fStack_4ca0.encryption_key.bytes,"BBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBB",0x20);
  fdb_open(&pfStack_4d08,"./dummy1",&fStack_4ca0);
  fdb_kvs_open_default(pfStack_4d08,&pfStack_4d10,&fStack_4cc8);
  fVar2 = fdb_set_log_callback(pfStack_4d10,logCallbackFunc,"api_wrapper_test");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_set_kv(pfStack_4d10,(void *)0x0,0,(void *)0x0,0);
    if (fVar2 != FDB_RESULT_INVALID_ARGS) goto LAB_00119c74;
    uVar7 = 0;
    do {
      sprintf(acStack_4aa8,"key%d",uVar7);
      sprintf(acStack_49a8,"body%d",uVar7);
      pfVar5 = pfStack_4d10;
      sVar4 = strlen(acStack_4aa8);
      valuelen = strlen(acStack_49a8);
      fVar2 = fdb_set_kv(pfVar5,acStack_4aa8,sVar4,acStack_49a8,valuelen);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        rekey_test();
        goto LAB_00119c56;
      }
      uVar6 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar6;
    } while (uVar6 != 10);
    asStack_4cf8[1] = 0x726162ffffffff;
    asStack_4cf8[2] = 0xbdbdbdbdbdbdbdbd;
    uStack_4ce0 = 0xbdbdbdbd;
    uStack_4cdc = 0xbdbdbdbd;
    uStack_4cd8 = 0xbdbdbdbd;
    uStack_4cd4 = 0xbdbdbdbd;
    uStack_4cd0 = 0xbdbdbdbd;
    new_key.bytes[4] = 0xbd;
    new_key.bytes[5] = 0xbd;
    new_key.bytes[6] = 0xbd;
    new_key.bytes[7] = 0xbd;
    new_key.bytes[8] = 0xbd;
    new_key.bytes[9] = 0xbd;
    new_key.bytes[10] = 0xbd;
    new_key.bytes[0xb] = 0xbd;
    new_key.algorithm = -1;
    new_key.bytes[0] = 'b';
    new_key.bytes[1] = 'a';
    new_key.bytes[2] = 'r';
    new_key.bytes[3] = '\0';
    new_key.bytes[0xc] = 0xbd;
    new_key.bytes[0xd] = 0xbd;
    new_key.bytes[0xe] = 0xbd;
    new_key.bytes[0xf] = 0xbd;
    new_key.bytes[0x10] = 0xbd;
    new_key.bytes[0x11] = 0xbd;
    new_key.bytes[0x12] = 0xbd;
    new_key.bytes[0x13] = 0xbd;
    new_key.bytes[0x14] = 0xbd;
    new_key.bytes[0x15] = 0xbd;
    new_key.bytes[0x16] = 0xbd;
    new_key.bytes[0x17] = 0xbd;
    new_key.bytes[0x18] = 0xbd;
    new_key.bytes[0x19] = 0xbd;
    new_key.bytes[0x1a] = 0xbd;
    new_key.bytes[0x1b] = 0xbd;
    new_key.bytes[0x1c] = 0xbd;
    new_key.bytes[0x1d] = 0xbd;
    new_key.bytes[0x1e] = 0xbd;
    new_key.bytes[0x1f] = 0xbd;
    fVar2 = fdb_rekey(pfStack_4d08,new_key);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00119c79;
    fdb_kvs_close(pfStack_4d10);
    fdb_close(pfStack_4d08);
    fStack_4ca0.encryption_key.algorithm = -1;
    builtin_memcpy(fStack_4ca0.encryption_key.bytes,"bar",4);
    fStack_4ca0.encryption_key.bytes[4] = 0xbd;
    fStack_4ca0.encryption_key.bytes[5] = 0xbd;
    fStack_4ca0.encryption_key.bytes[6] = 0xbd;
    fStack_4ca0.encryption_key.bytes[7] = 0xbd;
    fStack_4ca0.encryption_key.bytes[8] = 0xbd;
    fStack_4ca0.encryption_key.bytes[9] = 0xbd;
    fStack_4ca0.encryption_key.bytes[10] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0xb] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0xc] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0xd] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0xe] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0xf] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0x10] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0x11] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0x12] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0x13] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0x14] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0x15] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0x16] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0x17] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0x18] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0x19] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0x1a] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0x1b] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0x1c] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0x1d] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0x1e] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0x1f] = 0xbd;
    fVar2 = fdb_open(&pfStack_4d08,"./dummy1",&fStack_4ca0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00119c80;
    fVar2 = fdb_kvs_open_default(pfStack_4d08,&pfStack_4d10,&fStack_4cc8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_set_log_callback(pfStack_4d10,logCallbackFunc,"api_wrapper_test");
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00119c8e;
      uVar7 = 0;
      while( true ) {
        sprintf(acStack_4aa8,"key%d",uVar7);
        pfVar5 = pfStack_4d10;
        sVar4 = strlen(acStack_4aa8);
        fVar2 = fdb_get_kv(pfVar5,acStack_4aa8,sVar4,&pvStack_4d00,asStack_4cf8);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        sprintf(acStack_4ba8,"body%d",uVar7);
        ptr = pvStack_4d00;
        iVar3 = bcmp(pvStack_4d00,acStack_4ba8,asStack_4cf8[0]);
        if (iVar3 != 0) goto LAB_00119c56;
        fdb_free_block(ptr);
        uVar6 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar6;
        if (uVar6 == 10) {
          fdb_kvs_close(pfStack_4d10);
          fdb_close(pfStack_4d08);
          fdb_shutdown();
          memleak_end();
          pcVar8 = "%s PASSED\n";
          if (rekey_test()::__test_pass != '\0') {
            pcVar8 = "%s FAILED\n";
          }
          fprintf(_stderr,pcVar8,"encryption rekey test");
          return;
        }
      }
LAB_00119c66:
      rekey_test();
      goto LAB_00119c6d;
    }
  }
  else {
LAB_00119c6d:
    rekey_test();
LAB_00119c74:
    rekey_test();
LAB_00119c79:
    rekey_test();
LAB_00119c80:
    rekey_test();
  }
  rekey_test();
LAB_00119c8e:
  rekey_test();
  return;
LAB_0011968a:
  pfStack_4500 = (fdb_kvs_handle *)0x11968f;
  open_multi_files_kvs_test();
LAB_0011968f:
  pfStack_4500 = (fdb_kvs_handle *)0x119694;
  open_multi_files_kvs_test();
LAB_00119694:
  pfStack_4500 = (fdb_kvs_handle *)0x119699;
  open_multi_files_kvs_test();
LAB_00119699:
  pfStack_4500 = (fdb_kvs_handle *)0x11969e;
  open_multi_files_kvs_test();
  pfVar5 = (fdb_kvs_handle *)handle;
LAB_0011969e:
  pfStack_4500 = (fdb_kvs_handle *)0x1196a3;
  open_multi_files_kvs_test();
LAB_001196a3:
  pfStack_4500 = (fdb_kvs_handle *)0x1196a8;
  open_multi_files_kvs_test();
LAB_001196a8:
  pfStack_4500 = (fdb_kvs_handle *)0x1196ad;
  open_multi_files_kvs_test();
LAB_001196ad:
  pfStack_4500 = (fdb_kvs_handle *)0x1196b2;
  open_multi_files_kvs_test();
LAB_001196b2:
  pfStack_4500 = (fdb_kvs_handle *)0x1196b7;
  open_multi_files_kvs_test();
  goto LAB_001196b7;
LAB_00119c56:
  rekey_test();
  goto LAB_00119c66;
}

Assistant:

void open_multi_files_kvs_test()
{
    TEST_INIT();
    memleak_start();

    int i, j, r;
    int vb;
    int n = 10;
    int n_files = 8;
    int n_kvs = 128;
    char keybuf[256], bodybuf[256];
    char fname[256];

    fdb_file_handle **dbfiles = alca(fdb_file_handle*, n_files);
    fdb_kvs_handle **kvs = alca(fdb_kvs_handle*, n_files*n_kvs);
    fdb_kvs_handle **snap_kvs = alca(fdb_kvs_handle*, n_files*n_kvs);
    fdb_iterator *iterator;
    fdb_doc *rdoc;
    fdb_kvs_info kvs_info;
    fdb_status status;

    // remove previous dummy test files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.compaction_mode = FDB_COMPACTION_MANUAL;
    fconfig.durability_opt = FDB_DRB_ASYNC;

    // 1024 kvs via 128 per dbfile
    for(j=0;j<n_files;++j){
        sprintf(fname, "dummy%d", j);
        status = fdb_open(&dbfiles[j], fname, &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        for(i=0;i<n_kvs;++i){
            vb = j*n_kvs+i;
            sprintf(fname, "kvs%d", vb);
            status = fdb_kvs_open(dbfiles[j], &kvs[vb], fname, &kvs_config);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    // load across all kvs
    vb = n_files*n_kvs;
    for(i=0;i<vb;++i){
        for(j=0;j<n;++j){
            sprintf(keybuf, "key%08d", j);
            sprintf(bodybuf, "value%08d", j);
            status = fdb_set_kv(kvs[i], keybuf, strlen(keybuf)+1, bodybuf, strlen(bodybuf)+1);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    // commit
    for(j=0;j<n_files;++j){
        if((j%2)==0){
            status = fdb_commit(dbfiles[j], FDB_COMMIT_NORMAL);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            status = fdb_commit(dbfiles[j], FDB_COMMIT_MANUAL_WAL_FLUSH);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    // snapshot 1 kvs per file
    for(i=0;i<vb;i+=n_kvs){
        fdb_get_kvs_info(kvs[i], &kvs_info);
        TEST_CHK(kvs_info.last_seqnum == (uint64_t)n);
        status = fdb_snapshot_open(kvs[i], &snap_kvs[i], kvs_info.last_seqnum);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // compact default
    for(j=0;j<n_files;++j){
        status = fdb_compact(dbfiles[j], NULL);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // iterate over snapshots
    rdoc = NULL;
    for(i=0;i<vb;i+=n_kvs){
        j=0;
        fdb_iterator_init(snap_kvs[i], &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
        do {
            // verify keys
            status = fdb_iterator_get(iterator, &rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            sprintf(keybuf, "key%08d", j);
            TEST_CHK(!strcmp(keybuf, (char *)rdoc->key));
            j++;
        } while(fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
        fdb_iterator_close(iterator);
    }
    fdb_doc_free(rdoc);

    // delete all keys
    vb = n_files*n_kvs;
    for(i=0;i<vb;++i){
        for(j=0;j<n;++j){
            sprintf(keybuf, "key%08d", j);
            status = fdb_del_kv(kvs[i], keybuf, strlen(keybuf)+1);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }


    // custom compact
    for(j=0;j<n_files;++j){
        sprintf(fname, "dummy_compact%d", j);
        status = fdb_compact(dbfiles[j], fname);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // iterate again over actual kvs with no deletes
    rdoc = NULL;
    for(i=0;i<vb;i+=n_kvs){
        status = fdb_iterator_init(kvs[i], &iterator, NULL, 0, NULL, 0, FDB_ITR_NO_DELETES);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        do {
            // verify keys
            status = fdb_iterator_get(iterator, &rdoc);
            TEST_CHK(status != FDB_RESULT_SUCCESS);
        } while(fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
        fdb_iterator_close(iterator);
    }
    fdb_doc_free(rdoc);


    // cleanup
    for(j=0;j<n_files;++j){
        status = fdb_close(dbfiles[j]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    fdb_shutdown();
    memleak_end();

    TEST_RESULT("open multi files kvs test");
}